

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

int pybind11_getbuffer(PyObject *obj,Py_buffer *view,int flags)

{
  long *plVar1;
  long *plVar2;
  tuple_iterator tVar3;
  type_info *ptVar4;
  buffer_info *pbVar5;
  long lVar6;
  long *plVar7;
  sequence_fast_readonly sVar8;
  handle local_38;
  
  local_38.m_ptr = obj->ob_type->tp_mro;
  if (local_38.m_ptr != (PyObject *)0x0) {
    (local_38.m_ptr)->ob_refcnt = (local_38.m_ptr)->ob_refcnt + 1;
  }
  sVar8.ptr = (PyObject **)&local_38.m_ptr[1].ob_type;
  if (((local_38.m_ptr)->ob_type->tp_flags & 0x2000000) != 0) {
    sVar8.ptr = (PyObject **)*sVar8.ptr;
  }
  tVar3 = pybind11::tuple::end((tuple *)&local_38);
  for (; (sequence_fast_readonly)sVar8.ptr != tVar3.super_sequence_fast_readonly.ptr;
      sVar8.ptr = sVar8.ptr + 1) {
    while (ptVar4 = pybind11::detail::get_type_info((PyTypeObject *)*sVar8.ptr),
          ptVar4 != (type_info *)0x0) {
      if ((ptVar4->get_buffer != (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0) ||
         (sVar8.ptr = sVar8.ptr + 1,
         (sequence_fast_readonly)sVar8.ptr == tVar3.super_sequence_fast_readonly.ptr))
      goto LAB_00117d7b;
    }
  }
  ptVar4 = (type_info *)0x0;
LAB_00117d7b:
  pybind11::object::~object((object *)&local_38);
  if ((view == (Py_buffer *)0x0) || (ptVar4 == (type_info *)0x0)) {
    if (view == (Py_buffer *)0x0) goto LAB_00117e42;
  }
  else if (ptVar4->get_buffer != (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0) {
    view->suboffsets = (Py_ssize_t *)0x0;
    view->internal = (void *)0x0;
    view->shape = (Py_ssize_t *)0x0;
    view->strides = (Py_ssize_t *)0x0;
    view->readonly = 0;
    view->ndim = 0;
    view->format = (char *)0x0;
    view->len = 0;
    view->itemsize = 0;
    view->buf = (void *)0x0;
    view->obj = (PyObject *)0x0;
    pbVar5 = (*ptVar4->get_buffer)(obj,ptVar4->get_buffer_data);
    view->obj = obj;
    view->ndim = 1;
    view->internal = pbVar5;
    view->buf = *(void **)pbVar5;
    lVar6 = *(long *)(pbVar5 + 8);
    view->itemsize = lVar6;
    view->len = lVar6;
    plVar2 = *(long **)(pbVar5 + 0x48);
    plVar1 = *(long **)(pbVar5 + 0x40);
    for (plVar7 = plVar1; plVar7 != plVar2; plVar7 = plVar7 + 1) {
      lVar6 = lVar6 * *plVar7;
      view->len = lVar6;
    }
    if ((flags & 4U) != 0) {
      view->format = *(char **)(pbVar5 + 0x18);
    }
    if ((~flags & 0x18U) == 0) {
      view->ndim = *(int *)(pbVar5 + 0x38);
      view->strides = *(Py_ssize_t **)(pbVar5 + 0x58);
      view->shape = plVar1;
    }
    obj->ob_refcnt = obj->ob_refcnt + 1;
    return 0;
  }
  view->obj = (PyObject *)0x0;
LAB_00117e42:
  PyErr_SetString(_PyExc_BufferError,"pybind11_getbuffer(): Internal error");
  return -1;
}

Assistant:

inline int pybind11_getbuffer(PyObject *obj, Py_buffer *view, int flags) {
    // Look for a `get_buffer` implementation in this type's info or any bases (following MRO).
    type_info *tinfo = nullptr;
    for (auto type : reinterpret_borrow<tuple>(Py_TYPE(obj)->tp_mro)) {
        tinfo = get_type_info((PyTypeObject *) type.ptr());
        if (tinfo && tinfo->get_buffer)
            break;
    }
    if (view == nullptr || !tinfo || !tinfo->get_buffer) {
        if (view)
            view->obj = nullptr;
        PyErr_SetString(PyExc_BufferError, "pybind11_getbuffer(): Internal error");
        return -1;
    }
    std::memset(view, 0, sizeof(Py_buffer));
    buffer_info *info = tinfo->get_buffer(obj, tinfo->get_buffer_data);
    view->obj = obj;
    view->ndim = 1;
    view->internal = info;
    view->buf = info->ptr;
    view->itemsize = info->itemsize;
    view->len = view->itemsize;
    for (auto s : info->shape)
        view->len *= s;
    if ((flags & PyBUF_FORMAT) == PyBUF_FORMAT)
        view->format = const_cast<char *>(info->format.c_str());
    if ((flags & PyBUF_STRIDES) == PyBUF_STRIDES) {
        view->ndim = (int) info->ndim;
        view->strides = &info->strides[0];
        view->shape = &info->shape[0];
    }
    Py_INCREF(view->obj);
    return 0;
}